

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

int Cba_FonRangeSize(Cba_Ntk_t *p,int f)

{
  int iVar1;
  undefined4 local_18;
  int f_local;
  Cba_Ntk_t *p_local;
  
  iVar1 = Cba_FonIsConst(f);
  if (iVar1 == 0) {
    iVar1 = Cba_FonRange(p,f);
    local_18 = Cba_NtkRangeSize(p,iVar1);
  }
  else {
    local_18 = Cba_FonConstRangeSize(p,f);
  }
  return local_18;
}

Assistant:

static inline int            Cba_FonRangeSize( Cba_Ntk_t * p, int f )        { return Cba_FonIsConst(f) ? Cba_FonConstRangeSize(p, f):Cba_NtkRangeSize(p, Cba_FonRange(p, f)); }